

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

void anm_write(anm_archive_t *anm,char *filename,uint version)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  char *pcVar5;
  undefined4 *puVar6;
  uint *buffer;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  FILE *__stream;
  size_t sVar18;
  long lVar19;
  size_t sVar20;
  long lVar21;
  long *plVar22;
  uint uVar23;
  long *plVar24;
  short *buffer_00;
  list_node_t *plVar25;
  ulong uVar26;
  size_t sVar27;
  anm_instr0_t new_instr;
  undefined8 local_80;
  long local_78;
  long local_70;
  undefined8 local_68;
  uint local_60;
  uint local_5c;
  size_t local_58;
  long *local_50;
  list_node_t *local_48;
  ulong local_40;
  ulong local_38;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    anm_write_cold_1();
    uVar11 = *(uint *)((long)filename + 0xc);
    uVar23 = *(uint *)filename;
    uVar2 = *(uint *)((long)filename + 0x10);
    uVar12 = *(uint *)((long)filename + 0x14);
    uVar3 = *(uint *)((long)filename + 0x18);
    uVar7 = *(undefined8 *)((long)filename + 0x1c);
    uVar8 = *(undefined8 *)((long)filename + 0x24);
    *(uint *)filename = (uint)(ushort)*(uint *)((long)filename + 4);
    *(uint *)((long)filename + 4) = (uint)*(ushort *)((long)filename + 6);
    *(uint *)((long)filename + 8) = 0;
    *(uint *)((long)filename + 0xc) = (uint)*(ushort *)((long)filename + 10);
    *(uint *)((long)filename + 0x10) = (uint)(ushort)uVar11;
    *(uint *)((long)filename + 0x14) = (uint)*(ushort *)((long)filename + 0xe);
    *(uint *)((long)filename + 0x18) = 0;
    *(uint *)((long)filename + 0x1c) = uVar2;
    *(uint *)((long)filename + 0x20) = (uint)(ushort)uVar12;
    *(uint *)((long)filename + 0x24) = (uint)*(ushort *)((long)filename + 0x16);
    *(uint *)((long)filename + 0x28) = uVar23;
    *(uint *)((long)filename + 0x2c) = uVar3;
    *(undefined8 *)((long)filename + 0x30) = uVar7;
    *(undefined8 *)((long)filename + 0x38) = uVar8;
    return;
  }
  plVar25 = (list_node_t *)&anm->entries;
  sVar27 = 0x14;
  local_58 = sVar27;
  if (version == 0x13) {
    sVar27 = 0x28;
    local_58 = sVar27;
  }
  do {
    plVar25 = plVar25->next;
    if (plVar25 == (list_node_t *)0x0) {
      fclose(__stream);
      return;
    }
    plVar4 = (long *)plVar25->data;
    local_78 = file_tell((FILE *)__stream);
    fflush(__stream);
    sVar18 = strlen((char *)plVar4[2]);
    lVar21 = local_78;
    plVar24 = plVar4 + 7;
    local_5c = 1;
    uVar23 = 0;
    plVar22 = plVar24;
    do {
      local_38 = (ulong)uVar23;
      plVar22 = (long *)*plVar22;
      local_5c = local_5c - 1;
      uVar23 = uVar23 + 1;
    } while (plVar22 != (long *)0x0);
    local_50 = plVar4 + 9;
    local_60 = 0xffffffff;
    plVar22 = local_50;
    do {
      plVar22 = (long *)*plVar22;
      local_60 = local_60 + 1;
    } while (plVar22 != (long *)0x0);
    local_68 = CONCAT44(local_68._4_4_,-local_5c);
    local_48 = plVar25;
    file_seek((FILE *)__stream,local_78 + (ulong)-local_5c * 4 + (ulong)local_60 * 8 + 0x40);
    lVar19 = file_tell((FILE *)__stream);
    *(int *)(*plVar4 + 0x1c) = (int)lVar19 - (int)lVar21;
    pcVar5 = (char *)plVar4[2];
    sVar20 = strlen(pcVar5);
    file_write((FILE *)__stream,pcVar5,sVar20);
    file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar18 & 0xf));
    if (((char *)plVar4[3] != (char *)0x0) && (*(int *)(*plVar4 + 0x28) == 0)) {
      sVar18 = strlen((char *)plVar4[3]);
      lVar21 = file_tell((FILE *)__stream);
      *(int *)(*plVar4 + 0x24) = (int)lVar21 - (int)local_78;
      pcVar5 = (char *)plVar4[3];
      sVar20 = strlen(pcVar5);
      file_write((FILE *)__stream,pcVar5,sVar20);
      file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar18 & 0xf));
    }
    lVar21 = file_tell((FILE *)__stream);
    plVar22 = local_50;
    uVar26 = lVar21 - local_78;
    while (plVar24 = (long *)*plVar24, plVar24 != (long *)0x0) {
      file_write((FILE *)__stream,(void *)plVar24[2],sVar27);
    }
    lVar21 = local_78;
    local_40 = uVar26;
    while( true ) {
      plVar22 = (long *)*plVar22;
      if (plVar22 == (long *)0x0) {
        local_70 = 0;
      }
      else {
        local_70 = plVar22[2];
      }
      iVar17 = (int)lVar21;
      if (plVar22 == (long *)0x0) break;
      lVar21 = file_tell((FILE *)__stream);
      *(int *)(*(long *)(local_70 + 8) + 4) = (int)lVar21 - iVar17;
      plVar24 = (long *)(local_70 + 0x20);
LAB_001104f9:
      lVar21 = local_78;
      uVar26 = local_80;
      plVar24 = (long *)*plVar24;
      if (plVar24 != (long *)0x0) {
        buffer_00 = (short *)plVar24[2];
        if (*(int *)(*plVar4 + 0x28) == 0) goto LAB_00110530;
        if (*buffer_00 == -1) {
          buffer_00[1] = 0;
          sVar27 = 8;
        }
        else {
          sVar1 = buffer_00[1];
          buffer_00[1] = sVar1 + 8U;
          sVar27 = (size_t)(ushort)(sVar1 + 8U);
        }
        goto LAB_00110571;
      }
      if (*(int *)(local_70 + 0x50) == 0) {
        if (*(int *)(*plVar4 + 0x28) == 0) {
          local_80 = local_80 & 0xffffffff00000000;
          sVar27 = 4;
        }
        else {
          local_80 = 0xffff;
          sVar27 = 8;
        }
        file_write((FILE *)__stream,&local_80,sVar27);
      }
    }
    if (*(short *)(*plVar4 + 0x34) != 0) {
      lVar19 = file_tell((FILE *)__stream);
      *(int *)(*plVar4 + 0x30) = (int)lVar19 - iVar17;
      file_write((FILE *)__stream,(void *)plVar4[1],0x10);
      file_write((FILE *)__stream,(void *)plVar4[0xb],(ulong)*(uint *)(plVar4[1] + 0xc));
    }
    if (local_48->next == (list_node_t *)0x0) {
      iVar17 = 0;
    }
    else {
      lVar19 = file_tell((FILE *)__stream);
      iVar17 = (int)lVar19 - iVar17;
    }
    puVar6 = (undefined4 *)*plVar4;
    puVar6[0xe] = iVar17;
    *puVar6 = (undefined4)local_68;
    puVar6[1] = local_60;
    file_seek((FILE *)__stream,lVar21);
    buffer = (uint *)*plVar4;
    uVar23 = buffer[10];
    if (uVar23 < 7) {
      file_write((FILE *)__stream,buffer,0x40);
      lVar21 = local_78;
      sVar9 = local_58;
      plVar24 = local_50;
      uVar26 = local_40;
      uVar10 = local_38;
      uVar23 = local_5c;
    }
    else {
      uVar11 = buffer[1];
      uVar12 = buffer[3];
      uVar13 = buffer[4];
      uVar14 = buffer[5];
      uVar2 = buffer[7];
      uVar15 = buffer[8];
      uVar16 = buffer[9];
      local_68 = *(undefined8 *)(buffer + 0xb);
      uVar3 = buffer[0xd];
      local_70 = *(long *)(buffer + 0xe);
      buffer[0] = 0;
      buffer[1] = 0;
      buffer[2] = 0;
      buffer[3] = 0;
      buffer[4] = 0;
      buffer[5] = 0;
      buffer[6] = 0;
      buffer[7] = 0;
      buffer[8] = 0;
      buffer[9] = 0;
      buffer[10] = 0;
      buffer[0xb] = 0;
      buffer[0xc] = 0;
      buffer[0xd] = 0;
      buffer[0xe] = 0;
      buffer[0xf] = 0;
      *(short *)(buffer + 1) = (short)*buffer;
      *(short *)((long)buffer + 6) = (short)uVar11;
      *(undefined2 *)(buffer + 2) = 0;
      *(short *)((long)buffer + 10) = (short)uVar12;
      *(short *)(buffer + 3) = (short)uVar13;
      *(short *)((long)buffer + 0xe) = (short)uVar14;
      buffer[4] = uVar2;
      *(short *)(buffer + 5) = (short)uVar15;
      *(short *)((long)buffer + 0x16) = (short)uVar16;
      *buffer = uVar23;
      *(undefined8 *)(buffer + 6) = local_68;
      buffer[8] = uVar3;
      *(long *)(buffer + 9) = local_70;
      file_write((FILE *)__stream,(void *)*plVar4,0x40);
      convert_header_to_old((anm_header06_t *)*plVar4);
      lVar21 = local_78;
      sVar9 = local_58;
      plVar24 = local_50;
      uVar26 = local_40;
      uVar10 = local_38;
      uVar23 = local_5c;
    }
    while (sVar27 = local_58, local_78 = lVar21, local_58 = sVar9, local_50 = plVar24, uVar23 != 0)
    {
      local_80._4_4_ = (undefined4)(local_80 >> 0x20);
      local_80 = CONCAT44(local_80._4_4_,(int)uVar26);
      file_write((FILE *)__stream,&local_80,4);
      uVar23 = (int)uVar10 - 1;
      lVar21 = local_78;
      sVar9 = local_58;
      plVar24 = local_50;
      uVar26 = (ulong)(uint)((int)uVar26 + (int)sVar27);
      uVar10 = (ulong)uVar23;
      local_58 = sVar27;
    }
    while (plVar24 = (long *)*plVar24, plVar24 != (long *)0x0) {
      file_write((FILE *)__stream,*(void **)(plVar24[2] + 8),8);
    }
    file_seek((FILE *)__stream,lVar21 + (ulong)*(uint *)(*plVar4 + 0x38));
    plVar25 = local_48;
  } while( true );
LAB_00110530:
  local_80._4_4_ = SUB84(uVar26,4);
  local_80._0_4_ = CONCAT13((char)buffer_00[1],CONCAT12((char)*buffer_00,buffer_00[2]));
  file_write((FILE *)__stream,&local_80,4);
  sVar27 = local_80 >> 0x18 & 0xff;
  if (sVar27 != 0) {
    buffer_00 = buffer_00 + 4;
LAB_00110571:
    file_write((FILE *)__stream,buffer_00,sVar27);
  }
  goto LAB_001104f9;
}

Assistant:

static void
anm_write(
    anm_archive_t* anm,
    const char* filename,
    unsigned version)
{
    FILE* stream;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        sprite19_t* sprite;
        anm_script_t* script;
        long base = file_tell(stream);
        fflush(stream);
        unsigned int namepad = 0;
        static const char padding[16] = "";
        unsigned int j;
        unsigned int spriteoffset;

        namepad = (16 - strlen(entry->name) % 16);

        unsigned int sprite_count = 0;
        list_for_each(&entry->sprites, sprite)
            ++sprite_count;

        unsigned int script_count = 0;
        list_for_each(&entry->scripts, script)
            ++script_count;

        file_seek(stream, base +
                          sizeof(anm_header06_t) +
                          sprite_count * sizeof(uint32_t) +
                          script_count * sizeof(anm_offset_t));

        entry->header->nameoffset = file_tell(stream) - base;
        file_write(stream, entry->name, strlen(entry->name));
        file_write(stream, padding, namepad);

        if (entry->name2 && entry->header->version == 0) {
            namepad = (16 - strlen(entry->name2) % 16);

            entry->header->y = file_tell(stream) - base;
            file_write(stream, entry->name2, strlen(entry->name2));
            file_write(stream, padding, namepad);
        }

        /* NEWHU: 19 */
        const unsigned spritesize = version == 19 ? sizeof(sprite19_t) : sizeof(sprite_t);
        spriteoffset = file_tell(stream) - base;

        list_for_each(&entry->sprites, sprite)
            file_write(stream, sprite, spritesize);

        list_for_each(&entry->scripts, script) {
            script->offset->offset = file_tell(stream) - base;

            anm_instr_t* instr;
            list_for_each(&script->raw_instrs, instr) {
                if (entry->header->version == 0) {
                    anm_instr0_t new_instr;
                    new_instr.time = instr->time;
                    new_instr.type = instr->type;
                    new_instr.length = instr->length;
                    file_write(stream, &new_instr, sizeof(new_instr));
                    if (new_instr.length) {
                        file_write(stream,
                            instr->data,
                            new_instr.length);
                    }
                } else {
                    if (instr->type == 0xffff) {
                        instr->length = 0;
                        file_write(stream, instr, sizeof(*instr));
                    } else {
                        instr->length += sizeof(*instr);
                        file_write(stream, instr, instr->length);
                    }
                }
            }

            if (!script->no_sentinel) {
                if (entry->header->version == 0) {
                    anm_instr0_t sentinel = { 0, 0, 0 };
                    file_write(stream, &sentinel, sizeof(sentinel));
                } else {
                    anm_instr_t sentinel = { 0xffff, 0, 0, 0 };
                    file_write(stream, &sentinel, sizeof(sentinel));
                }
            }
        }

        if (entry->header->hasdata) {
            entry->header->thtxoffset = file_tell(stream) - base;

            file_write(stream, entry->thtx, sizeof(thtx_header_t));
            file_write(stream, entry->data, entry->thtx->size);
        }

        if (list_is_last_iteration())
            entry->header->nextoffset = 0;
        else
            entry->header->nextoffset = file_tell(stream) - base;

        entry->header->sprites = sprite_count;
        entry->header->scripts = script_count;

        file_seek(stream, base);

        if (entry->header->version >= 7) {
            convert_header_to_11(entry->header);

            file_write(stream, entry->header, sizeof(anm_header06_t));
            convert_header_to_old(entry->header);
        } else {
            file_write(stream, entry->header, sizeof(anm_header06_t));
        }

        for (j = 0; j < sprite_count; ++j) {
            uint32_t ofs = spriteoffset + j * spritesize;
            file_write(stream, &ofs, sizeof(uint32_t));
        }

        list_for_each(&entry->scripts, script) {
            file_write(stream, script->offset, sizeof(*script->offset));
        }

        file_seek(stream, base + entry->header->nextoffset);
    }

    fclose(stream);
}